

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCTest.cpp
# Opt level: O2

Function * RandomFunction(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Function *this;
  String *pSVar7;
  ulong uVar8;
  
  this = luna::GC::NewFunction(&g_gc,GCGen2);
  pSVar7 = RandomString();
  luna::Function::SetModuleName(this,pSVar7);
  iVar1 = rand();
  luna::Function::SetLine(this,iVar1 % 1000);
  iVar2 = rand();
  iVar1 = -10;
  if (-10 < iVar2 % 0x3df) {
    iVar1 = iVar2 % 0x3df;
  }
  for (iVar2 = 0; uVar3 = rand(), iVar1 + 10 != iVar2; iVar2 = iVar2 + 1) {
    iVar4 = rand();
    iVar5 = rand();
    iVar6 = rand();
    luna::Function::AddInstruction
              (this,(Instruction)
                    ((iVar6 % 0x80 & 0xffU) +
                     ((iVar5 % 0x80 & 0xffU) << 8 |
                     (iVar4 % 0x80 & 0xffU) << 0x10 | uVar3 % 9 << 0x18) + 0x1000000),iVar2);
  }
  uVar8 = 0;
  if (0 < (int)((long)(int)uVar3 % 5)) {
    uVar8 = (long)(int)uVar3 % 5 & 0xffffffff;
  }
  while( true ) {
    iVar1 = rand();
    iVar2 = (int)uVar8;
    uVar8 = (ulong)(iVar2 - 1);
    if (iVar2 == 0) break;
    luna::Function::AddConstNumber(this,(double)(iVar1 % 100000));
  }
  uVar8 = 0;
  if (0 < (int)((long)iVar1 % 5)) {
    uVar8 = (long)iVar1 % 5 & 0xffffffff;
  }
  while (iVar1 = (int)uVar8, uVar8 = (ulong)(iVar1 - 1), iVar1 != 0) {
    pSVar7 = RandomString();
    luna::Function::AddConstString(this,pSVar7);
  }
  if (((this->super_GCObject).field_0x10 & 3) != 0) {
    luna::GC::SetBarrier(&g_gc,&this->super_GCObject);
  }
  return this;
}

Assistant:

luna::Function * RandomFunction()
{
    auto f = g_gc.NewFunction();

    auto s = RandomString();
    f->SetModuleName(s);
    f->SetLine(RandomNum(1000));

    int instruction_count = RandomRange(10, 1000);
    for (int i = 0; i < instruction_count; ++i)
    {
        unsigned int op_min = luna::OpType_LoadNil;
        unsigned int op_max = luna::OpType_GetGlobal;
        luna::OpType op = static_cast<luna::OpType>(RandomRange(op_min, op_max));
        luna::Instruction instruction(op, RandomNum(128), RandomNum(128), RandomNum(128));
        f->AddInstruction(instruction, i);
    }

    int const_num = RandomNum(5);
    for (int i = 0; i < const_num; ++i)
        f->AddConstNumber(RandomNum(100000));

    int const_str = RandomNum(5);
    for (int i = 0; i < const_str; ++i)
        f->AddConstString(RandomString());

    CHECK_BARRIER(g_gc, f);

    return f;
}